

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

float calculate_volume(DUMB_IT_SIGRENDERER *sigrenderer,IT_PLAYING *playing,double volume)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  float fVar8;
  
  if (volume == 0.0) goto LAB_005b1037;
  if ((playing->channel->flags & 1) != 0) goto LAB_005b1025;
  switch(playing->tremolo_waveform) {
  case '\x01':
    uVar3 = (ulong)playing->tremolo_time;
    pcVar5 = 
    "@??>>==<<;;::99887766554433221100//..--,,++**))((\'\'&&%%$$##\"\"!!  \x1f\x1f\x1e\x1e\x1d\x1d\x1c\x1c\x1b\x1b\x1a\x1a\x19\x19\x18\x18\x17\x17\x16\x16\x15\x15\x14\x14\x13\x13\x12\x12\x11\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\v\v\n\n\t\t\b\b\a\a\x06\x06\x05\x05\x04\x04\x03\x03\x02\x02\x01\x01"
    ;
    break;
  case '\x02':
    uVar3 = (ulong)playing->tremolo_time;
    pcVar5 = 
    "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@"
    ;
    break;
  case '\x03':
    iVar2 = rand();
    iVar2 = iVar2 % 0x81 + -0x40;
    goto LAB_005b0f15;
  case '\x04':
    uVar3 = (ulong)playing->tremolo_time;
    pcVar5 = it_xm_squarewave;
    break;
  case '\x05':
    uVar3 = (ulong)playing->tremolo_time;
    goto LAB_005b0efd;
  case '\x06':
    uVar3 = (ulong)*(byte *)(playing->ramp_delta +
                            (ulong)((sigrenderer->sigdata->flags & 0x80) == 0) + 6) ^ 0xff;
LAB_005b0efd:
    pcVar5 = "";
    break;
  default:
    uVar3 = (ulong)playing->tremolo_time;
    pcVar5 = "";
  }
  iVar2 = (int)pcVar5[uVar3];
LAB_005b0f15:
  iVar2 = (uint)playing->tremolo_depth * iVar2;
  iVar6 = (uint)playing->volume * 0x20;
  uVar7 = iVar6 + iVar2;
  if (uVar7 == 0 || SCARRY4(iVar6,iVar2) != (int)uVar7 < 0) {
LAB_005b1025:
    bVar1 = false;
  }
  else {
    uVar4 = 0x800;
    if ((int)uVar7 < 0x800) {
      uVar4 = uVar7;
    }
    if ((sigrenderer->sigdata->flags & 0x200) != 0) {
      iVar2 = aiPTMVolScaled[uVar4 >> 5];
      if ((int)uVar7 < 0x800) {
        iVar2 = (int)((uVar4 & 0x1f) * aiPTMVolScaled[(ulong)(uVar4 >> 5) + 1] +
                     iVar2 * (0x20 - (uVar4 & 0x1f))) >> 5;
      }
      uVar4 = iVar2 * 2;
    }
    volume = volume * 7.275957614183426e-12 * (double)playing->sample->global_volume *
             (double)playing->channel_volume * (double)sigrenderer->sigdata->mixing_volume *
             (double)sigrenderer->globalvolume * (double)(int)uVar4;
    bVar1 = true;
    if ((volume != 0.0) && (playing->instrument != (IT_INSTRUMENT *)0x0)) {
      if (((playing->enabled_envelopes & 1) != 0) &&
         ((playing->env_instrument->volume_envelope).n_nodes != '\0')) {
        volume = volume * 6.103515625e-05 * (double)(playing->volume_envelope).value;
      }
      volume = volume * 7.62939453125e-06 *
               (double)playing->fadeoutcount * (double)playing->instrument->global_volume;
    }
  }
  fVar8 = 0.0;
  if (bVar1) {
LAB_005b1037:
    fVar8 = (float)volume;
  }
  return fVar8;
}

Assistant:

static float calculate_volume(DUMB_IT_SIGRENDERER *sigrenderer, IT_PLAYING *playing, double volume)
{
	if (volume != 0) {
		int vol;

		if (playing->channel->flags & IT_CHANNEL_MUTED)
			return 0;

		if ((playing->channel->tremor_time & 192) == 128)
			return 0;

		switch (playing->tremolo_waveform)
		{
		default:
			vol = it_sine[playing->tremolo_time];
			break;
		case 1:
			vol = it_sawtooth[playing->tremolo_time];
			break;
		case 2:
			vol = it_squarewave[playing->tremolo_time];
			break;
		case 3:
			vol = (rand() % 129) - 64;
			break;
		case 4:
			vol = it_xm_squarewave[playing->tremolo_time];
			break;
		case 5:
			vol = it_xm_ramp[playing->tremolo_time];
			break;
		case 6:
			vol = it_xm_ramp[255-((sigrenderer->sigdata->flags & IT_WAS_A_MOD)?playing->vibrato_time:playing->tremolo_time)];
			break;
		}
		vol *= playing->tremolo_depth;

		vol = (playing->volume << 5) + vol;

		if (vol <= 0)
			return 0;

		if (vol > 64 << 5)
			vol = 64 << 5;

		if ( sigrenderer->sigdata->flags & IT_WAS_A_PTM )
		{
			int v = aiPTMVolScaled[ vol >> 5 ];
			if ( vol < 64 << 5 )
			{
				int f = vol & ( ( 1 << 5 ) - 1 );
				int f2 = ( 1 << 5 ) - f;
				int v2 = aiPTMVolScaled[ ( vol >> 5 ) + 1 ];
				v = ( v * f2 + v2 * f ) >> 5;
			}
			vol = v << 1;
		}

		volume *= vol; /* 64 << 5 */
		volume *= playing->sample->global_volume; /* 64 */
		volume *= playing->channel_volume; /* 64 */
		volume *= sigrenderer->globalvolume; /* 128 */
		volume *= sigrenderer->sigdata->mixing_volume; /* 128 */
		volume *= 1.0f / ((64 << 5) * 64.0f * 64.0f * 128.0f * 128.0f);

		if (volume && playing->instrument) {
			if (playing->enabled_envelopes & IT_ENV_VOLUME && playing->env_instrument->volume_envelope.n_nodes) {
				volume *= envelope_get_y(&playing->env_instrument->volume_envelope, &playing->volume_envelope);
				volume *= 1.0f / (64 << IT_ENVELOPE_SHIFT);
			}
			volume *= playing->instrument->global_volume; /* 128 */
			volume *= playing->fadeoutcount; /* 1024 */
			volume *= 1.0f / (128.0f * 1024.0f);
		}
	}

	return (float)volume;
}